

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_triple_parse_mutex_required(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  char *s;
  float c;
  int b;
  int a;
  char *args [1];
  char *args3 [3];
  char *args2 [3];
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    args[0] = "program";
    args2[2] = "8.0";
    args2[0] = "program";
    args2[1] = "-c";
    args3[2] = "def";
    args3[0] = "program";
    args3[1] = "--delta";
    a = 0;
    b = 0;
    c = 7.0;
    s = strdup("abc");
    if (s == (char *)0x0) {
      pcVar2 = "Failed to allocate";
    }
    else {
      cargo_add_mutex_group(cargo,CARGO_MUTEXGRP_ONE_REQUIRED,"mg",(char *)0x0,(char *)0x0);
      cargo_add_option(cargo,0,"<!mg> --alpha -a","an option","i",&a);
      cargo_add_option(cargo,0,"<!mg> --beta -b","another option","i",&b);
      cargo_add_option(cargo,0,"--centauri -c","another option","f",&c);
      cargo_add_option(cargo,0,"--delta -d","another option","s",&s);
      iVar1 = cargo_parse(cargo,CARGO_SKIP_CHECK_MUTEX,1,1,args);
      if (iVar1 == 0) {
        pcVar2 = "Expected s to be \'abc\'";
        if ((s != (char *)0x0) && (iVar1 = strcmp(s,"abc"), iVar1 == 0)) {
          iVar1 = cargo_parse(cargo,CARGO_SKIP_CHECK_MUTEX,1,3,args2);
          if (iVar1 == 0) {
            if ((s != (char *)0x0) && (iVar1 = strcmp(s,"abc"), iVar1 == 0)) {
              pcVar2 = (char *)0x0;
              iVar1 = cargo_parse(cargo,0,1,3,args3);
              if (-1 < iVar1) {
                pcVar2 = "Parse did not fail 3";
              }
            }
          }
          else {
            pcVar2 = "Parse failed 2";
          }
        }
      }
      else {
        pcVar2 = "Parse failed 1";
      }
    }
    _cargo_xfree(&s);
    cargo_destroy(&cargo);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_triple_parse_mutex_required)
{
    char *args[] = { "program" };
    char *args2[] = { "program", "-c", "8.0" };
    char *args3[] = { "program", "--delta", "def" };
    int a = 0;
    int b = 0;
    float c = 7.0f;
    char *s = strdup("abc");
    cargo_assert(s, "Failed to allocate");

    ret |= cargo_add_mutex_group(cargo, CARGO_MUTEXGRP_ONE_REQUIRED, "mg", NULL, NULL);

    ret |= cargo_add_option(cargo, 0, "<!mg> --alpha -a", "an option", "i", &a);
    ret |= cargo_add_option(cargo, 0, "<!mg> --beta -b", "another option", "i", &b);
    ret |= cargo_add_option(cargo, 0, "--centauri -c", "another option", "f", &c);
    ret |= cargo_add_option(cargo, 0, "--delta -d", "another option", "s", &s);

    ret = cargo_parse(cargo, CARGO_SKIP_CHECK_MUTEX, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failed 1");
    cargo_assert(s && !strcmp(s, "abc"), "Expected s to be 'abc'");

    ret = cargo_parse(cargo, CARGO_SKIP_CHECK_MUTEX, 1, sizeof(args2) / sizeof(args2[0]), args2);
    cargo_assert(ret == 0, "Parse failed 2");
    cargo_assert(s && !strcmp(s, "abc"), "Expected s to be 'abc'");

    ret = cargo_parse(cargo, 0, 1, sizeof(args3) / sizeof(args3[0]), args3);
    cargo_assert(ret < 0, "Parse did not fail 3");

    _TEST_CLEANUP();
    _cargo_xfree(&s);
}